

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interner.h
# Opt level: O0

void SymbolInterner::Initialize(void)

{
  SymbolInterner *pSVar1;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [39];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [39];
  allocator local_129;
  string local_128 [39];
  allocator local_101;
  string local_100 [39];
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [39];
  allocator local_39;
  string local_38 [48];
  
  if (g_the_interner == (SymbolInterner *)0x0) {
    pSVar1 = (SymbolInterner *)operator_new(0x50);
    SymbolInterner(pSVar1);
    g_the_interner = pSVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"quote",&local_39);
    Intern(pSVar1,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"define",&local_61);
    Intern(pSVar1,(string *)local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"set!",&local_89);
    Intern(pSVar1,(string *)local_88);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"lambda",&local_b1);
    Intern(pSVar1,(string *)local_b0);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"if",&local_d9);
    Intern(pSVar1,(string *)local_d8);
    std::__cxx11::string::~string(local_d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"begin",&local_101);
    Intern(pSVar1,(string *)local_100);
    std::__cxx11::string::~string(local_100);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_128,"unquote",&local_129);
    Intern(pSVar1,(string *)local_128);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator((allocator<char> *)&local_129);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"unquote-splicing",&local_151);
    Intern(pSVar1,(string *)local_150);
    std::__cxx11::string::~string(local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_178,"quasiquote",&local_179);
    Intern(pSVar1,(string *)local_178);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)&local_179);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a0,"append",&local_1a1);
    Intern(pSVar1,(string *)local_1a0);
    std::__cxx11::string::~string(local_1a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"defmacro",&local_1c9);
    Intern(pSVar1,(string *)local_1c8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1f0,"let",&local_1f1);
    Intern(pSVar1,(string *)local_1f0);
    std::__cxx11::string::~string(local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"and",&local_219);
    Intern(pSVar1,(string *)local_218);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    pSVar1 = g_the_interner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"or",&local_241);
    Intern(pSVar1,(string *)local_240);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    return;
  }
  __assert_fail("g_the_interner == nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/swgillespie[P]jet/src/interner.h"
                ,0x4a,"static void SymbolInterner::Initialize()");
}

Assistant:

static void Initialize() {
    assert(g_the_interner == nullptr);
    g_the_interner = new SymbolInterner();
    g_the_interner->Intern("quote");
    g_the_interner->Intern("define");
    g_the_interner->Intern("set!");
    g_the_interner->Intern("lambda");
    g_the_interner->Intern("if");
    g_the_interner->Intern("begin");
    g_the_interner->Intern("unquote");
    g_the_interner->Intern("unquote-splicing");
    g_the_interner->Intern("quasiquote");
    g_the_interner->Intern("append");
    g_the_interner->Intern("defmacro");
    g_the_interner->Intern("let");
    g_the_interner->Intern("and");
    g_the_interner->Intern("or");
  }